

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

bool check_sidestep(CHAR_DATA *ch,CHAR_DATA *victim,int skill,int mod)

{
  bool bVar1;
  int iVar2;
  char type [4608];
  
  bVar1 = is_npc(victim);
  if ((!bVar1) &&
     (((bVar1 = is_npc(ch), !bVar1 || (bVar1 = is_affected_by(ch,0x12), !bVar1)) &&
      (bVar1 = style_check((int)gsn_sidestep,(int)victim->pcdata->style), bVar1)))) {
    iVar2 = get_skill(victim,(int)gsn_sidestep);
    if (skill == 0) {
      if (iVar2 < 2) {
        return false;
      }
      builtin_strncpy(type,"attack",7);
    }
    else {
      if (iVar2 < 2) {
        return false;
      }
      strcpy(type,skill_table[skill].name);
      mod = (int)(((float)mod / 100.0) * (float)iVar2);
    }
    if (((((victim->fighting == (CHAR_DATA *)0x0) && (bVar1 = can_see(victim,ch), bVar1)) &&
         ((bVar1 = is_affected_by(ch,0x10), !bVar1 &&
          ((bVar1 = is_affected(victim,(int)gsn_hold_person), !bVar1 &&
           (bVar1 = is_awake(victim), bVar1)))))) && (-5 < victim->pcdata->energy_state)) &&
       ((bVar1 = is_affected(victim,(int)gsn_bind_feet), !bVar1 &&
        (bVar1 = is_affected(victim,(int)gsn_creeping_tomb), !bVar1)))) {
      iVar2 = number_percent();
      if (iVar2 < mod) {
        act("Anticipating the coming strike, $N deftly sidesteps your $t.",ch,type,victim,3);
        act("Anticipating the coming strike, you deftly sidestep $n\'s $t.",ch,type,victim,2);
        WAIT_STATE(ch,0x18);
        return true;
      }
      act("You notice $n bearing down on you too late, and fail to sidestep his $t.",ch,type,victim,
          2);
    }
  }
  return false;
}

Assistant:

bool check_sidestep(CHAR_DATA *ch, CHAR_DATA *victim, int skill, int mod)
{
	int chance;
	char type[MSL];

	if (is_npc(victim) || (is_npc(ch) && is_affected_by(ch, AFF_CHARM)))
		return false;

	if (!style_check(gsn_sidestep, victim->pcdata->style))
		return false;

	if (skill == 0)
	{
		if (get_skill(victim, gsn_sidestep) < 2)
			return false;

		chance = mod;
		sprintf(type, "attack");
	}
	else
	{
		chance = get_skill(victim, gsn_sidestep);

		if (chance < 2)
			return false;

		sprintf(type, "%s", skill_table[skill].name);
		chance = (int)(chance * ((float)mod / 100));
	}

	if (victim->fighting)
		return false;

	if (!can_see(victim, ch))
		return false;

	if (is_affected_by(ch, AFF_HIDE))
		return false;

	if (is_affected(victim, gsn_hold_person))
		return false;

	if (!is_awake(victim))
		return false;

	if (victim->pcdata->energy_state < -4)
		return false;

	if (is_affected(victim, gsn_bind_feet))
		return false;

	if (is_affected(victim, gsn_creeping_tomb))
		return false;

	if (number_percent() < chance)
	{
		act("Anticipating the coming strike, $N deftly sidesteps your $t.", ch, type, victim, TO_CHAR);
		act("Anticipating the coming strike, you deftly sidestep $n's $t.", ch, type, victim, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return true;
	}
	else
	{
		act("You notice $n bearing down on you too late, and fail to sidestep his $t.", ch, type, victim, TO_VICT);
	}

	return false;
}